

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void cave_store(chunk *c,char *name,_Bool known,_Bool keep_all)

{
  char *pcVar1;
  chunk *local_28;
  chunk *stored;
  _Bool keep_all_local;
  _Bool known_local;
  char *name_local;
  chunk *c_local;
  
  local_28 = c;
  if (!keep_all) {
    local_28 = (chunk *)chunk_write((chunk_conflict *)c);
  }
  if (local_28->name != (char *)0x0) {
    string_free(local_28->name);
  }
  pcVar1 = string_make(name);
  local_28->name = pcVar1;
  if (known) {
    pcVar1 = string_append(local_28->name," known");
    local_28->name = pcVar1;
  }
  local_28->turn = turn;
  chunk_list_add((chunk_conflict *)local_28);
  return;
}

Assistant:

static void cave_store(struct chunk *c, char *name, bool known, bool keep_all)
{
	struct chunk *stored;
	if (keep_all) {
		stored = c;
	} else {
		stored = chunk_write(c);
	}
	if (stored->name) {
		string_free(stored->name);
	}
	stored->name = string_make(name);
	if (known) {
		stored->name = string_append(stored->name, " known");
	}
	stored->turn = turn;
	chunk_list_add(stored);
}